

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::run(CPU *this)

{
  CPU *this_local;
  
  do {
    IF(this);
    ID(this);
    if ((this->current_order->EX_need & 1U) != 0) {
      EX(this);
    }
    if ((this->current_order->MEM_need & 1U) != 0) {
      MEM(this);
    }
    if ((this->current_order->WB_need & 1U) != 0) {
      WB(this);
    }
    if (((this->CPU_MEM).jump_flag & 1U) == 0) {
      memory::jump(&this->CPU_MEM,4);
    }
    else {
      (this->CPU_MEM).jump_flag = false;
    }
    if (this->current_order != (order *)0x0) {
      operator_delete(this->current_order,0x20);
    }
  } while( true );
}

Assistant:

void CPU::run() {
    while(true) {
        IF();
        ID();
        if (current_order->EX_need)
            EX();
        if (current_order->MEM_need)
            MEM();
        if (current_order->WB_need)
            WB();
        if(!CPU_MEM.jump_flag) CPU_MEM.jump(4);
        else CPU_MEM.jump_flag=false;
         delete current_order;
    }
}